

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

void __thiscall
depspawn::internal::TaskPool::common_parallel_for<unsigned_long,main::__0>
          (TaskPool *this,unsigned_long begin,unsigned_long end,unsigned_long step,
          anon_class_1_0_00000001_for__M_f *f,bool relaunch_threads,bool is_hp)

{
  unsigned_long *in_RCX;
  TaskPool *in_RDX;
  TaskPool *in_RSI;
  TaskPool *in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  unsigned_long *args;
  TaskPool *f_00;
  TaskPool *this_00;
  undefined8 local_10;
  
  args = in_RCX;
  f_00 = in_RDX;
  this_00 = in_RSI;
  launch_threads(in_RDI);
  for (local_10 = in_RSI; local_10 < in_RDX; local_10 = (TaskPool *)((long)in_RCX + (long)local_10))
  {
    if ((in_stack_00000008 & 1) == 0) {
      enqueue<main::__0_const&,unsigned_long&>
                (this_00,(anon_class_1_0_00000001_for__M_f *)f_00,args);
    }
    else {
      hp_enqueue<main::__0_const&,unsigned_long&>
                (this_00,(anon_class_1_0_00000001_for__M_f *)f_00,args);
    }
  }
  wait(in_RDI,(void *)(ulong)(in_R9B & 1));
  return;
}

Assistant:

void common_parallel_for(Index begin, Index end, Index step, const F& f, const bool relaunch_threads, const bool is_hp)
  {
    this->launch_threads();

    while (begin < end) {
      if (is_hp) {
        this->hp_enqueue(f, begin);
      } else {
        this->enqueue(f, begin);
      }
      begin += step;
    }

    this->wait(relaunch_threads);
  }